

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4c1210::ContentProvider::provideStreamData
          (ContentProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  allocator<char> local_b1;
  QPDFObjectHandle local_b0;
  string all_description;
  QPDFObjGen local_80 [4];
  string description;
  Pl_Concatenate concat;
  
  Pl_Concatenate::Pl_Concatenate(&concat,"concatenate",p);
  local_80[0] = QPDFObjectHandle::getObjGen(&this->from_page);
  QPDFObjGen::unparse_abi_cxx11_(&all_description,local_80,' ');
  std::operator+(&description,"contents from page object ",&all_description);
  std::__cxx11::string::~string((string *)&all_description);
  all_description._M_dataplus._M_p = (pointer)&all_description.field_2;
  all_description._M_string_length = 0;
  all_description.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"/Contents",&local_b1);
  QPDFObjectHandle::getKey(&local_b0,(string *)&this->from_page);
  QPDFObjectHandle::pipeContentStreams
            (&local_b0,&concat.super_Pipeline,&description,&all_description);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_80);
  Pl_Concatenate::manualFinish(&concat);
  std::__cxx11::string::~string((string *)&all_description);
  std::__cxx11::string::~string((string *)&description);
  Pl_Concatenate::~Pl_Concatenate(&concat);
  return;
}

Assistant:

void
ContentProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    Pl_Concatenate concat("concatenate", p);
    std::string description = "contents from page object " + from_page.getObjGen().unparse(' ');
    std::string all_description;
    from_page.getKey("/Contents").pipeContentStreams(&concat, description, all_description);
    concat.manualFinish();
}